

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> * __thiscall
helics::apps::Connector::buildPossibleConnectionList
          (vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
           *__return_storage_ptr__,Connector *this,string_view startingInterface,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *tagList)

{
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var1;
  pointer pCVar2;
  pointer pCVar3;
  pointer psVar4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last2;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  char *pcVar5;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view testString;
  bool bVar6;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
  _Var7;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var8;
  iterator iVar9;
  type match_1;
  element_type *peVar10;
  ulong uVar11;
  pointer psVar12;
  type match;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>_>
  pVar13;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  string_view startingInterface_local;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  searched;
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_88;
  Connector *local_70;
  string mstring;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  startingInterface_local._M_str = startingInterface._M_str;
  startingInterface_local._M_len = startingInterface._M_len;
  (__return_storage_ptr__->
  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVar13 = CLI::std::
           _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
           ::equal_range(&(this->connections)._M_h,&startingInterface_local);
  _Var7._M_cur = (__node_type *)
                 pVar13.first.
                 super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                 ._M_cur;
  if (_Var7._M_cur != (__node_type *)0x0) {
    searched._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &searched._M_t._M_impl.super__Rb_tree_header._M_header;
    searched._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         searched._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    searched._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    searched._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    searched._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         searched._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::_M_insert_unique<std::basic_string_view<char,std::char_traits<char>>const&>
              ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)&searched,&startingInterface_local);
    for (; (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
            )_Var7._M_cur !=
           pVar13.second.
           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
           ._M_cur.
           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
        ; _Var7._M_cur = (__node_type *)((_Var7._M_cur)->super__Hash_node_base)._M_nxt) {
      _Var8._M_current =
           *(unsigned_long **)
            ((long)&((_Var7._M_cur)->
                    super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>
                    ._M_storage._M_storage + 0x38);
      _Var1._M_current =
           *(unsigned_long **)
            ((long)&((_Var7._M_cur)->
                    super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>
                    ._M_storage._M_storage + 0x40);
      if ((_Var8._M_current == _Var1._M_current) ||
         (_Var8 = std::
                  find_first_of<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )(tagList->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start,
                             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )(tagList->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_finish,_Var8,_Var1),
         _Var8._M_current !=
         (tagList->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_finish)) {
        std::vector<helics::apps::Connection,std::allocator<helics::apps::Connection>>::
        emplace_back<helics::apps::Connection_const&>
                  ((vector<helics::apps::Connection,std::allocator<helics::apps::Connection>> *)
                   __return_storage_ptr__,
                   (Connection *)
                   ((long)&((_Var7._M_cur)->
                           super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>
                           ._M_storage._M_storage + 0x10));
        pCVar2 = (__return_storage_ptr__->
                 super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        __x._M_len = pCVar2[-1].interface1._M_len;
        __x._M_str = pCVar2[-1].interface1._M_str;
        __y._M_str = startingInterface_local._M_str;
        __y._M_len = startingInterface_local._M_len;
        bVar6 = std::operator==(__x,__y);
        if (!bVar6) {
          pCVar2 = (__return_storage_ptr__->
                   super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          mstring._M_dataplus._M_p = (pointer)pCVar2[-1].interface1._M_len;
          mstring._M_string_length = (size_type)pCVar2[-1].interface1._M_str;
          pcVar5 = pCVar2[-1].interface2._M_str;
          pCVar2[-1].interface1._M_len = pCVar2[-1].interface2._M_len;
          pCVar2[-1].interface1._M_str = pcVar5;
          pCVar2[-1].interface2._M_len = (size_t)mstring._M_dataplus._M_p;
          pCVar2[-1].interface2._M_str = (char *)mstring._M_string_length;
        }
      }
    }
    local_70 = this;
    for (uVar11 = 0;
        pCVar2 = (__return_storage_ptr__->
                 super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar11 < (ulong)(((long)(__return_storage_ptr__->
                                super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2) / 0x50);
        uVar11 = uVar11 + 1) {
      iVar9 = CLI::std::
              _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::find(&searched._M_t,&pCVar2[uVar11].interface2);
      if ((_Rb_tree_header *)iVar9._M_node == &searched._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_insert_unique<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)&searched,
                   &(__return_storage_ptr__->
                    super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar11].interface2);
        pVar13 = CLI::std::
                 _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                 ::equal_range(&(this->connections)._M_h,
                               &(__return_storage_ptr__->
                                super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar11].interface2);
        _Var7._M_cur = (__node_type *)
                       pVar13.first.
                       super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                       ._M_cur;
        if (_Var7._M_cur != (__node_type *)0x0) {
          for (; (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                  )_Var7._M_cur !=
                 pVar13.second.
                 super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                 ._M_cur.
                 super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
              ; _Var7._M_cur = (__node_type *)((_Var7._M_cur)->super__Hash_node_base)._M_nxt) {
            _Var8._M_current =
                 *(unsigned_long **)
                  ((long)&((_Var7._M_cur)->
                          super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                          ).
                          super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>
                          ._M_storage._M_storage + 0x38);
            _Var1._M_current =
                 *(unsigned_long **)
                  ((long)&((_Var7._M_cur)->
                          super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                          ).
                          super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>
                          ._M_storage._M_storage + 0x40);
            if ((_Var8._M_current == _Var1._M_current) ||
               (_Var8 = std::
                        find_first_of<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                  ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    )(tagList->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_start,
                                   (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    )(tagList->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_finish,_Var8,_Var1),
               _Var8._M_current !=
               (tagList->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish)) {
              std::vector<helics::apps::Connection,std::allocator<helics::apps::Connection>>::
              emplace_back<helics::apps::Connection_const&>
                        ((vector<helics::apps::Connection,std::allocator<helics::apps::Connection>>
                          *)__return_storage_ptr__,
                         (Connection *)
                         ((long)&((_Var7._M_cur)->
                                 super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>
                                 ._M_storage._M_storage + 0x10));
              pCVar2 = (__return_storage_ptr__->
                       super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pCVar3 = (__return_storage_ptr__->
                       super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              __x_00._M_len = pCVar3[-1].interface1._M_len;
              __x_00._M_str = pCVar3[-1].interface1._M_str;
              __y_00._M_str = pCVar2[uVar11].interface2._M_str;
              __y_00._M_len = pCVar2[uVar11].interface2._M_len;
              bVar6 = std::operator==(__x_00,__y_00);
              if (!bVar6) {
                pCVar2 = (__return_storage_ptr__->
                         super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
                mstring._M_dataplus._M_p = (pointer)pCVar2[-1].interface1._M_len;
                mstring._M_string_length = (size_type)pCVar2[-1].interface1._M_str;
                pcVar5 = pCVar2[-1].interface2._M_str;
                pCVar2[-1].interface1._M_len = pCVar2[-1].interface2._M_len;
                pCVar2[-1].interface1._M_str = pcVar5;
                pCVar2[-1].interface2._M_len = (size_t)mstring._M_dataplus._M_p;
                pCVar2[-1].interface2._M_str = (char *)mstring._M_string_length;
              }
              iVar9 = CLI::std::
                      _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ::find(&searched._M_t,
                             &(__return_storage_ptr__->
                              super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                              )._M_impl.super__Vector_impl_data._M_finish[-1].interface2);
              if ((_Rb_tree_header *)iVar9._M_node != &searched._M_t._M_impl.super__Rb_tree_header)
              {
                CLI::std::
                vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
                pop_back(__return_storage_ptr__);
              }
            }
          }
        }
      }
    }
    CLI::std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Rb_tree(&searched._M_t);
    this = local_70;
  }
  if (((__return_storage_ptr__->
       super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>).
       _M_impl.super__Vector_impl_data._M_start ==
       (__return_storage_ptr__->
       super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>).
       _M_impl.super__Vector_impl_data._M_finish) || (this->alwaysCheckRegex == true)) {
    psVar12 = (this->regexMatchers).
              super__Vector_base<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (this->regexMatchers).
             super__Vector_base<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar12 != psVar4) {
      for (; psVar12 != psVar4; psVar12 = psVar12 + 1) {
        peVar10 = (psVar12->
                  super___shared_ptr<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        __first2._M_current =
             (peVar10->tags).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
        __last2._M_current =
             (peVar10->tags).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__first2._M_current == __last2._M_current) {
LAB_001b375f:
          testString._M_str = startingInterface_local._M_str;
          testString._M_len = startingInterface_local._M_len;
          RegexMatcher::generateMatch_abi_cxx11_(&mstring,peVar10,testString);
          if (mstring._M_string_length != 0) {
            searched._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            searched._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
            searched._M_t._M_impl._0_8_ = 0;
            searched._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            searched._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            _Stack_88._M_ptr = (element_type *)0x0;
            searched._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            _Stack_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffffffc0);
            CLI::std::
            __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ::operator=(&_Stack_88,
                        (__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         *)&stack0xffffffffffffffc0);
            CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
            peVar10 = (psVar12->
                      super___shared_ptr<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr;
            searched._M_t._M_impl._0_8_ = (peVar10->interface1)._M_len;
            searched._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 (peVar10->interface1)._M_str;
            CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &searched._M_t._M_impl.super__Rb_tree_header._M_node_count,&peVar10->tags);
            searched._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)((_Stack_88._M_ptr)->_M_dataplus)._M_p;
            searched._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)(_Stack_88._M_ptr)->_M_string_length;
            searched._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 (_Base_ptr)
                 CONCAT44(searched._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_,1);
            CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
            emplace_back<helics::apps::Connection>(__return_storage_ptr__,(Connection *)&searched);
            Connection::~Connection((Connection *)&searched);
          }
          std::__cxx11::string::~string((string *)&mstring);
        }
        else {
          _Var8 = std::
                  find_first_of<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )(tagList->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start,
                             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )(tagList->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_finish,__first2,__last2);
          if (_Var8._M_current !=
              (tagList->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish) {
            peVar10 = (psVar12->
                      super___shared_ptr<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr;
            goto LAB_001b375f;
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Connection>
    Connector::buildPossibleConnectionList(std::string_view startingInterface,
                                           const std::vector<std::size_t>& tagList) const
{
    std::vector<Connection> matches;
    auto [first, last] = connections.equal_range(startingInterface);
    if (first != connections.end()) {
        std::set<std::string_view> searched;
        searched.insert(startingInterface);

        for (auto match = first; match != last; ++match) {
            if (match->second.tags.empty() ||
                std::find_first_of(tagList.begin(),
                                   tagList.end(),
                                   match->second.tags.begin(),
                                   match->second.tags.end()) != tagList.end()) {
                matches.emplace_back(match->second);
                if (matches.back().interface1 != startingInterface) {
                    std::swap(matches.back().interface1, matches.back().interface2);
                }
            }
        }
        std::size_t cascadeIndex{0};
        while (cascadeIndex < matches.size()) {
            if (searched.find(matches[cascadeIndex].interface2) != searched.end()) {
                ++cascadeIndex;
                continue;
            }
            searched.insert(matches[cascadeIndex].interface2);
            std::tie(first, last) = connections.equal_range(matches[cascadeIndex].interface2);
            if (first != connections.end()) {
                for (auto match = first; match != last; ++match) {
                    if (match->second.tags.empty() ||
                        std::find_first_of(tagList.begin(),
                                           tagList.end(),
                                           match->second.tags.begin(),
                                           match->second.tags.end()) != tagList.end()) {
                        matches.emplace_back(match->second);
                        if (matches.back().interface1 != matches[cascadeIndex].interface2) {
                            std::swap(matches.back().interface1, matches.back().interface2);
                        }
                        if (searched.find(matches.back().interface2) != searched.end()) {
                            // this would already be references and create a cyclic reference
                            matches.pop_back();
                        }
                    }
                }
            }
            ++cascadeIndex;
        }
    }
    if (matches.empty() || alwaysCheckRegex) {
        if (!regexMatchers.empty()) {
            for (const auto& rmatcher : regexMatchers) {
                if (rmatcher->tags.empty() ||
                    std::find_first_of(tagList.begin(),
                                       tagList.end(),
                                       rmatcher->tags.begin(),
                                       rmatcher->tags.end()) != tagList.end()) {
                    auto mstring = rmatcher->generateMatch(startingInterface);
                    if (!mstring.empty()) {
                        Connection connection;
                        connection.stringBuffer = std::make_shared<std::string>(mstring);
                        connection.interface1 = rmatcher->interface1;
                        connection.tags = rmatcher->tags;
                        connection.interface2 = *connection.stringBuffer;
                        connection.direction = InterfaceDirection::FROM_TO;
                        matches.push_back(std::move(connection));
                    }
                }
            }
        }
    }
    return matches;
}